

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_whitelist_verify
              (secp256k1_context *ctx,secp256k1_whitelist_signature *sig,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,size_t n_keys,
              secp256k1_pubkey *sub_pubkey)

{
  ulong uVar1;
  int iVar2;
  uchar *b32;
  secp256k1_scalar *r;
  ulong uVar3;
  uchar msg32 [32];
  secp256k1_scalar s [255];
  secp256k1_gej pubs [255];
  
  if (sig == (secp256k1_whitelist_signature *)0x0) {
    secp256k1_whitelist_verify_cold_4();
  }
  else if (online_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_whitelist_verify_cold_3();
  }
  else if (offline_pubkeys == (secp256k1_pubkey *)0x0) {
    secp256k1_whitelist_verify_cold_2();
  }
  else {
    if (sub_pubkey != (secp256k1_pubkey *)0x0) {
      uVar1 = sig->n_keys;
      if (uVar1 != n_keys || 0xff < uVar1) {
        return 0;
      }
      if (uVar1 != 0) {
        b32 = sig->data;
        r = s;
        uVar3 = uVar1;
        do {
          b32 = b32 + 0x20;
          pubs[0].x.n[0]._0_4_ = 0;
          secp256k1_scalar_set_b32(r,b32,(int *)pubs);
          if ((int)pubs[0].x.n[0] != 0) {
            return 0;
          }
          if (((r->d[1] == 0 && r->d[0] == 0) && r->d[2] == 0) && r->d[3] == 0) {
            return 0;
          }
          r = r + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      iVar2 = secp256k1_whitelist_compute_keys_and_message
                        (ctx,msg32,pubs,online_pubkeys,offline_pubkeys,(int)uVar1,sub_pubkey);
      if (iVar2 != 0) {
        iVar2 = secp256k1_borromean_verify
                          ((secp256k1_scalar *)0x0,sig->data,s,pubs,&sig->n_keys,1,msg32,0x20);
        return iVar2;
      }
      return 0;
    }
    secp256k1_whitelist_verify_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_whitelist_verify(const secp256k1_context* ctx, const secp256k1_whitelist_signature *sig, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const size_t n_keys, const secp256k1_pubkey *sub_pubkey) {
    secp256k1_scalar s[MAX_KEYS];
    secp256k1_gej pubs[MAX_KEYS];
    unsigned char msg32[32];
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(online_pubkeys != NULL);
    ARG_CHECK(offline_pubkeys != NULL);
    ARG_CHECK(sub_pubkey != NULL);

    if (sig->n_keys > MAX_KEYS || sig->n_keys != n_keys) {
        return 0;
    }
    for (i = 0; i < sig->n_keys; i++) {
        int overflow = 0;
        secp256k1_scalar_set_b32(&s[i], &sig->data[32 * (i + 1)], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&s[i])) {
            return 0;
        }
    }

    /* Compute pubkeys: online_pubkey + tweaked(offline_pubkey + address), and message */
    if (!secp256k1_whitelist_compute_keys_and_message(ctx, msg32, pubs, online_pubkeys, offline_pubkeys, sig->n_keys, sub_pubkey)) {
        return 0;
    }
    /* Do verification */
    return secp256k1_borromean_verify(NULL, &sig->data[0], s, pubs, &sig->n_keys, 1, msg32, 32);
}